

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  ImDrawCmd *pIVar1;
  char cVar2;
  ushort uVar3;
  bool bVar4;
  char *pcVar5;
  int iVar6;
  size_t sVar7;
  void *pvVar8;
  char *pcVar9;
  ImFontGlyph *pIVar10;
  uint uVar11;
  char *text_end_00;
  char *pcVar12;
  char *in_text;
  float scale;
  float fVar13;
  float in_XMM1_Dc;
  float fVar14;
  float in_XMM1_Dd;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  uint c;
  uint local_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  ulong local_60;
  uint *local_58;
  ImDrawVert *local_50;
  int local_44;
  int local_40;
  ImU32 local_3c;
  char *local_38;
  
  local_78._0_4_ = pos.x;
  local_78._4_4_ = pos.y;
  local_3c = col;
  if (text_end == (char *)0x0) {
    fStack_70 = in_XMM1_Dc;
    local_78 = (undefined1  [8])pos;
    fStack_6c = in_XMM1_Dd;
    sVar7 = strlen(text_begin);
    text_end = text_begin + sVar7;
    in_XMM1_Dc = fStack_70;
    in_XMM1_Dd = fStack_6c;
  }
  local_88 = (float)(int)((float)local_78._4_4_ + (this->DisplayOffset).y);
  fVar17 = (float)(int)(float)local_78._4_4_;
  fVar18 = (float)(int)(float)local_78._4_4_;
  fVar19 = (float)(int)(float)local_78._4_4_;
  fVar26 = clip_rect->w;
  if (local_88 <= fVar26) {
    scale = size / this->FontSize;
    fVar15 = this->FontSize * scale;
    local_78._0_4_ = (float)local_78._0_4_ + (this->DisplayOffset).x;
    fStack_70 = in_XMM1_Dc;
    fStack_6c = in_XMM1_Dd;
    fStack_84 = fVar17;
    fStack_80 = fVar18;
    fStack_7c = fVar19;
    if (wrap_width <= 0.0) {
      fVar13 = local_88 + fVar15;
      fVar14 = clip_rect->y;
      if ((fVar13 < fVar14) && (text_begin < text_end && fVar13 < fVar14)) {
        do {
          local_88 = fVar13;
          fStack_84 = fVar17;
          fStack_80 = fVar18;
          fStack_7c = fVar19;
          pvVar8 = memchr(text_begin,10,(long)text_end - (long)text_begin);
          text_begin = (char *)((long)pvVar8 + 1);
          if (pvVar8 == (void *)0x0) {
            text_begin = text_end;
          }
          fVar17 = 0.0;
          fVar18 = 0.0;
          fVar19 = 0.0;
          fVar13 = fVar15 + local_88;
        } while ((fVar13 < fVar14) && (text_begin < text_end));
      }
    }
    text_end_00 = text_end;
    if ((wrap_width <= 0.0) &&
       (pcVar9 = text_begin, fVar17 = local_88, 10000 < (long)text_end - (long)text_begin)) {
      while ((text_end_00 = pcVar9, fVar17 < fVar26 && (pcVar9 < text_end))) {
        pvVar8 = memchr(pcVar9,10,(long)text_end - (long)pcVar9);
        pcVar9 = (char *)((long)pvVar8 + 1);
        if (pvVar8 == (void *)0x0) {
          pcVar9 = text_end;
        }
        fVar17 = fVar17 + fVar15;
      }
    }
    if (text_begin != text_end_00) {
      local_78._4_4_ = (float)(int)(float)local_78._4_4_;
      local_78._0_4_ = (float)(int)(float)local_78._0_4_;
      fStack_70 = (float)(int)fStack_70;
      fStack_6c = (float)(int)fStack_6c;
      iVar6 = (int)text_end_00 - (int)text_begin;
      local_44 = iVar6 * 6;
      local_40 = (draw_list->IdxBuffer).Size;
      ImDrawList::PrimReserve(draw_list,local_44,iVar6 * 4);
      local_50 = draw_list->_VtxWritePtr;
      local_58 = draw_list->_IdxWritePtr;
      local_60 = (ulong)draw_list->_VtxCurrentIdx;
      local_38 = (char *)0x0;
      fVar26 = (float)local_78._0_4_;
      fVar17 = (float)local_78._0_4_;
      fVar18 = local_88;
      fVar19 = fStack_84;
      fVar14 = fStack_80;
      fVar13 = fStack_7c;
      pcVar9 = local_38;
      fVar20 = (float)local_78._0_4_;
      pcVar12 = text_begin;
joined_r0x0014ff4a:
      do {
        if (text_end_00 <= text_begin) break;
        in_text = pcVar12;
        fVar16 = fVar20;
        fVar24 = local_88;
        fVar23 = fStack_84;
        fVar21 = fStack_80;
        fVar22 = fStack_7c;
        pcVar5 = local_38;
        if (0.0 < wrap_width) {
          if (pcVar9 == (char *)0x0) {
            pcVar9 = CalcWordWrapPositionA
                               (this,scale,text_begin,text_end_00,(fVar17 - fVar26) + wrap_width);
            fVar19 = 0.0;
            fVar14 = 0.0;
            fVar13 = 0.0;
            pcVar9 = pcVar9 + (pcVar9 == text_begin);
            fVar17 = (float)local_78._0_4_;
          }
          in_text = text_begin;
          fVar16 = fVar26;
          fVar24 = fVar18;
          fVar23 = fVar19;
          fVar21 = fVar14;
          fVar22 = fVar13;
          pcVar5 = pcVar9;
          if (pcVar9 <= text_begin) {
            do {
              if (text_end_00 <= text_begin) break;
              cVar2 = *text_begin;
              text_begin = text_begin + ((byte)(cVar2 - 9U) < 2 || cVar2 == ' ');
            } while ((cVar2 == ' ') || (cVar2 == '\t'));
            fVar26 = fVar17;
            fVar18 = fVar18 + fVar15;
            pcVar9 = (char *)0x0;
            goto joined_r0x0014ff4a;
          }
        }
        local_38 = pcVar5;
        fStack_7c = fVar22;
        fStack_80 = fVar21;
        fStack_84 = fVar23;
        local_88 = fVar24;
        local_8c = (uint)*in_text;
        if (*in_text < '\0') {
          iVar6 = ImTextCharFromUtf8(&local_8c,in_text,text_end_00);
          text_begin = in_text + iVar6;
          fVar17 = (float)local_78._0_4_;
          if (local_8c != 0) goto LAB_0015009c;
          bVar4 = true;
        }
        else {
          text_begin = in_text + 1;
LAB_0015009c:
          if (local_8c < 0x20) {
            if (local_8c != 0xd) {
              if (local_8c == 10) {
                local_88 = local_88 + fVar15;
                bVar4 = clip_rect->w <= local_88 && local_88 != clip_rect->w;
                fVar16 = fVar17;
                goto LAB_00150390;
              }
              goto LAB_001500d4;
            }
          }
          else {
LAB_001500d4:
            if (((local_8c & 0xffff) < (uint)(this->IndexLookup).Size) &&
               (uVar3 = (this->IndexLookup).Data[(ushort)local_8c], uVar3 != 0xffff)) {
              pIVar10 = (ImFontGlyph *)(&((this->Glyphs).Data)->field_0x0 + (uint)uVar3 * 0x28);
            }
            else {
              pIVar10 = this->FallbackGlyph;
            }
            if (pIVar10 != (ImFontGlyph *)0x0) {
              fVar26 = pIVar10->AdvanceX * scale;
              if (*(int *)pIVar10 < 0) {
                fVar19 = pIVar10->X0 * scale + fVar16;
                fVar18 = clip_rect->z;
                bVar4 = true;
                if (fVar19 <= fVar18) {
                  fVar13 = pIVar10->X1 * scale + fVar16;
                  fVar14 = clip_rect->x;
                  if (fVar14 <= fVar13) {
                    fVar25 = pIVar10->Y0 * scale + local_88;
                    fVar22 = pIVar10->Y1 * scale + local_88;
                    fVar20 = pIVar10->U0;
                    fVar24 = pIVar10->V0;
                    fVar23 = pIVar10->U1;
                    fVar21 = pIVar10->V1;
                    if (cpu_fine_clip) {
                      if (fVar19 < fVar14) {
                        fVar20 = fVar20 + (fVar23 - fVar20) *
                                          (1.0 - (fVar13 - fVar14) / (fVar13 - fVar19));
                        fVar19 = fVar14;
                      }
                      fVar14 = clip_rect->y;
                      if (fVar25 < fVar14) {
                        fVar24 = fVar24 + (fVar21 - fVar24) *
                                          (1.0 - (fVar22 - fVar14) / (fVar22 - fVar25));
                        fVar25 = fVar14;
                      }
                      if (fVar18 < fVar13) {
                        fVar23 = (fVar23 - fVar20) * ((fVar18 - fVar19) / (fVar13 - fVar19)) +
                                 fVar20;
                        fVar13 = fVar18;
                      }
                      fVar18 = clip_rect->w;
                      if (fVar18 < fVar22) {
                        fVar21 = (fVar21 - fVar24) * ((fVar18 - fVar25) / (fVar22 - fVar25)) +
                                 fVar24;
                        fVar22 = fVar18;
                      }
                      if (fVar22 <= fVar25) {
                        fVar16 = fVar16 + fVar26;
                        bVar4 = false;
                        goto LAB_00150385;
                      }
                    }
                    uVar11 = (uint)local_60;
                    *local_58 = uVar11;
                    local_58[1] = uVar11 + 1;
                    local_58[2] = uVar11 + 2;
                    local_58[3] = uVar11;
                    local_58[4] = uVar11 + 2;
                    local_58[5] = uVar11 + 3;
                    (local_50->pos).x = fVar19;
                    (local_50->pos).y = fVar25;
                    local_50->col = local_3c;
                    (local_50->uv).x = fVar20;
                    (local_50->uv).y = fVar24;
                    local_50[1].pos.x = fVar13;
                    local_50[1].pos.y = fVar25;
                    local_50[1].col = local_3c;
                    local_50[1].uv.x = fVar23;
                    local_50[1].uv.y = fVar24;
                    local_50[2].pos.x = fVar13;
                    local_50[2].pos.y = fVar22;
                    local_50[2].col = local_3c;
                    local_50[2].uv.x = fVar23;
                    local_50[2].uv.y = fVar21;
                    local_50[3].pos.x = fVar19;
                    local_50[3].pos.y = fVar22;
                    local_50[3].col = local_3c;
                    local_50[3].uv.x = fVar20;
                    local_50[3].uv.y = fVar21;
                    local_50 = local_50 + 4;
                    local_60 = (ulong)(uVar11 + 4);
                    local_58 = local_58 + 6;
                  }
                }
LAB_00150385:
                if (!bVar4) goto LAB_0015038e;
              }
              fVar16 = fVar16 + fVar26;
            }
          }
LAB_0015038e:
          bVar4 = false;
        }
LAB_00150390:
        fVar26 = fVar16;
        fVar18 = local_88;
        fVar19 = fStack_84;
        fVar14 = fStack_80;
        fVar13 = fStack_7c;
        pcVar9 = local_38;
        fVar20 = fVar16;
        pcVar12 = text_begin;
      } while (!bVar4);
      (draw_list->VtxBuffer).Size =
           (int)((ulong)((long)local_50 - (long)(draw_list->VtxBuffer).Data) >> 2) * -0x33333333;
      iVar6 = (int)((ulong)((long)local_58 - (long)(draw_list->IdxBuffer).Data) >> 2);
      (draw_list->IdxBuffer).Size = iVar6;
      pIVar1 = (draw_list->CmdBuffer).Data + (long)(draw_list->CmdBuffer).Size + -1;
      pIVar1->ElemCount = pIVar1->ElemCount + (iVar6 - (local_40 + local_44));
      draw_list->_VtxWritePtr = local_50;
      draw_list->_IdxWritePtr = local_58;
      draw_list->_VtxCurrentIdx = (uint)local_60;
    }
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui:: functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = IM_FLOOR(pos.x + DisplayOffset.x);
    pos.y = IM_FLOOR(pos.y + DisplayOffset.y);
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Fast-forward to first visible line
    const char* s = text_begin;
    if (y + line_height < clip_rect.y && !word_wrap_enabled)
        while (y + line_height < clip_rect.y && s < text_end)
        {
            s = (const char*)memchr(s, '\n', text_end - s);
            s = s ? s + 1 : text_end;
            y += line_height;
        }

    // For large text, scan for the last visible line in order to avoid over-reserving in the call to PrimReserve()
    // Note that very large horizontal line will still be affected by the issue (e.g. a one megabyte string buffer without a newline will likely crash atm)
    if (text_end - s > 10000 && !word_wrap_enabled)
    {
        const char* s_end = s;
        float y_end = y;
        while (y_end < clip_rect.w && s_end < text_end)
        {
            s_end = (const char*)memchr(s_end, '\n', text_end - s_end);
            s_end = s_end ? s_end + 1 : text_end;
            y_end += line_height;
        }
        text_end = s_end;
    }
    if (s == text_end)
        return;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;
                if (y > clip_rect.w)
                    break; // break out of main loop
                continue;
            }
            if (c == '\r')
                continue;
        }

        const ImFontGlyph* glyph = FindGlyph((ImWchar)c);
        if (glyph == NULL)
            continue;

        float char_width = glyph->AdvanceX * scale;
        if (glyph->Visible)
        {
            // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
            float x1 = x + glyph->X0 * scale;
            float x2 = x + glyph->X1 * scale;
            float y1 = y + glyph->Y0 * scale;
            float y2 = y + glyph->Y1 * scale;
            if (x1 <= clip_rect.z && x2 >= clip_rect.x)
            {
                // Render a character
                float u1 = glyph->U0;
                float v1 = glyph->V0;
                float u2 = glyph->U1;
                float v2 = glyph->V1;

                // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                if (cpu_fine_clip)
                {
                    if (x1 < clip_rect.x)
                    {
                        u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                        x1 = clip_rect.x;
                    }
                    if (y1 < clip_rect.y)
                    {
                        v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                        y1 = clip_rect.y;
                    }
                    if (x2 > clip_rect.z)
                    {
                        u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                        x2 = clip_rect.z;
                    }
                    if (y2 > clip_rect.w)
                    {
                        v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                        y2 = clip_rect.w;
                    }
                    if (y1 >= y2)
                    {
                        x += char_width;
                        continue;
                    }
                }

                // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                {
                    idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                    idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                    vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                    vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                    vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                    vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                    vtx_write += 4;
                    vtx_current_idx += 4;
                    idx_write += 6;
                }
            }
        }
        x += char_width;
    }

    // Give back unused vertices (clipped ones, blanks) ~ this is essentially a PrimUnreserve() action.
    draw_list->VtxBuffer.Size = (int)(vtx_write - draw_list->VtxBuffer.Data); // Same as calling shrink()
    draw_list->IdxBuffer.Size = (int)(idx_write - draw_list->IdxBuffer.Data);
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = vtx_current_idx;
}